

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O2

int asio_service_test::auto_quorum_size_election_test(void)

{
  __int_type_conflict _Var1;
  long lVar2;
  long lVar3;
  element_type *peVar4;
  bool bVar5;
  int iVar6;
  int32 iVar7;
  ostream *poVar8;
  int __how;
  int __how_00;
  int __how_01;
  __int_type_conflict _Var9;
  int __fd;
  int __fd_00;
  int __how_02;
  TestSm *with;
  size_t ii;
  unsigned_long __val;
  initializer_list<RaftAsioPkg_*> __l;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_00;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_01;
  initializer_list<RaftAsioPkg_*> __l_02;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_03;
  buffer_serializer bs;
  buffer_serializer bs_2;
  shared_ptr<RaftAsioPkg> s2;
  allocator_type local_2c9;
  ptr<buffer> msg;
  shared_ptr<RaftAsioPkg> s1;
  ptr<buffer> msg_2;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_290;
  RaftAsioPkg s1_new;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  string s1_addr;
  undefined1 local_128 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  undefined1 local_108 [16];
  string s2_addr;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  raft_params params;
  
  __fd_00 = (int)&bs;
  __how_02 = (int)&bs;
  __fd = (int)&bs;
  raft_functional_common::reset_log_files();
  std::__cxx11::string::string((string *)&s1_addr,"tcp://127.0.0.1:20010",(allocator *)&s1_new);
  std::__cxx11::string::string((string *)&s2_addr,"tcp://127.0.0.1:20020",(allocator *)&s1_new);
  s1_new.myId = 1;
  std::make_shared<RaftAsioPkg,int,std::__cxx11::string&>
            ((int *)&s1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s1_new
            );
  s1_new.myId = 2;
  std::make_shared<RaftAsioPkg,int,std::__cxx11::string&>
            ((int *)&s2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s1_new
            );
  s1_new._0_8_ = s1.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  s1_new.myEndpoint._M_dataplus._M_p =
       (pointer)s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __l._M_len = 2;
  __l._M_array = (iterator)&s1_new;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            (&pkgs,__l,(allocator_type *)&params);
  TestSuite::_msg("launching asio-raft servers\n");
  s1_new._0_8_ = s1_new._0_8_ & 0xffffffffffffff00;
  s1_new.myEndpoint._M_dataplus._M_p = (pointer)0x0;
  s1_new.myEndpoint._M_string_length = 0;
  s1_new.myEndpoint.field_2._M_allocated_capacity = 0;
  s1_new.myEndpoint.field_2._8_8_ = 0;
  s1_new.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ = 1;
  iVar6 = launch_servers(&pkgs,false,false,true,(init_options *)&s1_new);
  std::_Function_base::~_Function_base((_Function_base *)&s1_new.myEndpoint);
  if (iVar6 != 0) {
    poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar8 = std::operator<<(poVar8,"        time: ");
    poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&s1_new);
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"      thread: ");
    poVar8 = std::operator<<(poVar8,"\x1b[33m");
    lVar2 = *(long *)poVar8;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    poVar8 = std::operator<<(poVar8,0x30);
    params._0_8_ = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs,(id *)&params);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"          in: ");
    poVar8 = std::operator<<(poVar8,"\x1b[36m");
    poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
    poVar8 = std::operator<<(poVar8,"()\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"          at: ");
    poVar8 = std::operator<<(poVar8,"\x1b[32m");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar8 = std::operator<<(poVar8,"\x1b[0m:");
    poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x3f4);
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n");
    poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
    poVar8 = std::operator<<(poVar8,"0");
    poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
    poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
    iVar6 = -1;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,-1);
    std::operator<<(poVar8,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&s1_new);
    TestSuite::failHandler();
    goto LAB_0019071e;
  }
  TestSuite::_msg("organizing raft group\n");
  iVar6 = make_group(&pkgs);
  if (iVar6 != 0) {
    poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar8 = std::operator<<(poVar8,"        time: ");
    poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&s1_new);
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"      thread: ");
    poVar8 = std::operator<<(poVar8,"\x1b[33m");
    lVar2 = *(long *)poVar8;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    poVar8 = std::operator<<(poVar8,0x30);
    params._0_8_ = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs,(id *)&params);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"          in: ");
    poVar8 = std::operator<<(poVar8,"\x1b[36m");
    poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
    poVar8 = std::operator<<(poVar8,"()\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"          at: ");
    poVar8 = std::operator<<(poVar8,"\x1b[32m");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar8 = std::operator<<(poVar8,"\x1b[0m:");
    poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x3f7);
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n");
    poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
    poVar8 = std::operator<<(poVar8,"0");
    poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
    poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
    iVar6 = -1;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,-1);
    std::operator<<(poVar8,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&s1_new);
    TestSuite::failHandler();
    goto LAB_0019071e;
  }
  std::__cxx11::string::string((string *)&s1_new,"wait for Raft group ready",(allocator *)&params);
  TestSuite::sleep_sec(1,(string *)&s1_new);
  std::__cxx11::string::~string((string *)&s1_new);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<unsigned_long_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1019:28)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<unsigned_long_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1019:28)>
             ::_M_manager;
  nuraft::raft_server::set_inc_term_func
            (((s1.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->raftServer).
             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (inc_term_func *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<unsigned_long_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1019:28)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<unsigned_long_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1019:28)>
             ::_M_manager;
  nuraft::raft_server::set_inc_term_func
            (((s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->raftServer).
             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (inc_term_func *)&local_d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  nuraft::raft_server::get_current_params
            (&params,((s1.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     raftServer).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  params.auto_adjust_quorum_for_small_cluster_ = true;
  nuraft::raft_server::update_params
            (((s1.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->raftServer).
             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&params);
  nuraft::raft_server::update_params
            (((s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->raftServer).
             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&params);
  peVar4 = ((s1.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->raftServer).
           super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((peVar4->leader_).super___atomic_base<int>._M_i != peVar4->id_) ||
     ((peVar4->role_)._M_i != leader)) {
    poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar8 = std::operator<<(poVar8,"        time: ");
    poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&s1_new);
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"      thread: ");
    poVar8 = std::operator<<(poVar8,"\x1b[33m");
    lVar2 = *(long *)poVar8;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    poVar8 = std::operator<<(poVar8,0x30);
    bs._0_8_ = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"          in: ");
    poVar8 = std::operator<<(poVar8,"\x1b[36m");
    poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
    poVar8 = std::operator<<(poVar8,"()\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"          at: ");
    poVar8 = std::operator<<(poVar8,"\x1b[32m");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar8 = std::operator<<(poVar8,"\x1b[0m:");
    poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x406);
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"    value of: \x1b[1;34ms1->raftServer->is_leader()\x1b[0m\n");
    poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
    poVar8 = std::operator<<(poVar8,"true");
    poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
    poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
    poVar8 = std::operator<<(poVar8,"false");
    std::operator<<(poVar8,"\x1b[0m\n");
    goto LAB_00190709;
  }
  iVar7 = nuraft::raft_server::get_leader
                    (((s1.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     raftServer).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if (iVar7 == 1) {
    iVar7 = nuraft::raft_server::get_leader
                      (((s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       raftServer).
                       super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (iVar7 == 1) {
      for (__val = 0; __val != 10; __val = __val + 1) {
        std::__cxx11::to_string((string *)&s1_new,__val);
        nuraft::buffer::alloc
                  ((buffer *)&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                   (size_t)(s1_new.myEndpoint._M_dataplus._M_p + 4));
        nuraft::buffer_serializer::buffer_serializer
                  (&bs,(ptr<buffer> *)
                       &msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,LITTLE);
        nuraft::buffer_serializer::put_str(&bs,(string *)&s1_new);
        peVar4 = ((s1.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 raftServer).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                   &msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
        __l_00._M_len = 1;
        __l_00._M_array =
             (iterator)&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
        std::
        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
        vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                *)&bs_2,__l_00,(allocator_type *)&local_290);
        nuraft::raft_server::append_entries
                  ((raft_server *)local_108,
                   (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    *)peVar4);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
        std::
        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
        ~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 *)&bs_2);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&s1_new);
      }
      std::__cxx11::string::string((string *)&s1_new,"wait for replication",(allocator *)&bs);
      TestSuite::sleep_sec(1,(string *)&s1_new);
      std::__cxx11::string::~string((string *)&s1_new);
      with = (TestSm *)
             ((s1.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->sm).
             super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      bVar5 = raft_functional_common::TestSm::isSame
                        ((TestSm *)
                         ((s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         sm).super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,with,false);
      if (bVar5) {
        nuraft::raft_server::shutdown
                  (((s1.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   raftServer).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(int)with,__how);
        std::__shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>::reset
                  (&s1.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>);
        std::__cxx11::string::string((string *)&s1_new,"wait for quorum adjust",(allocator *)&bs);
        TestSuite::sleep_ms(5000,(string *)&s1_new);
        std::__cxx11::string::~string((string *)&s1_new);
        peVar4 = ((s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 raftServer).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((peVar4->leader_).super___atomic_base<int>._M_i == peVar4->id_) &&
           ((peVar4->role_)._M_i == leader)) {
          iVar7 = nuraft::raft_server::get_leader
                            (((s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              )->raftServer).
                             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
          if (iVar7 == 2) {
            _Var9 = ((((s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      raftServer).
                      super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
            std::__cxx11::to_string((string *)&s1_new,10);
            nuraft::buffer::alloc((buffer *)&msg,(size_t)(s1_new.myEndpoint._M_dataplus._M_p + 4));
            nuraft::buffer_serializer::buffer_serializer(&bs,&msg,LITTLE);
            nuraft::buffer_serializer::put_str(&bs,(string *)&s1_new);
            peVar4 = ((s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     raftServer).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                       &msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
            __l_01._M_len = 1;
            __l_01._M_array =
                 (iterator)&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
            std::
            vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
            ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                      *)&bs_2,__l_01,(allocator_type *)&local_290);
            nuraft::raft_server::append_entries
                      ((raft_server *)(local_128 + 0x10),
                       (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        *)peVar4);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110);
            std::
            vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
            ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                       *)&bs_2);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&msg_2.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__cxx11::string::~string((string *)&s1_new);
            std::__cxx11::string::string((string *)&s1_new,"wait for replication",(allocator *)&bs);
            TestSuite::sleep_sec(1,(string *)&s1_new);
            std::__cxx11::string::~string((string *)&s1_new);
            _Var1 = _Var9 + 1;
            if (_Var1 == ((((s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->raftServer).
                           super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->sm_commit_index_).super___atomic_base<unsigned_long>._M_i) {
              TestSuite::_msg("launching S1 again\n");
              RaftAsioPkg::RaftAsioPkg(&s1_new,1,&s1_addr);
              __l_02._M_len = 1;
              __l_02._M_array = (iterator)&msg;
              msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&s1_new;
              std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
                        ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)&bs_2,__l_02,
                         (allocator_type *)&msg_2);
              bs._0_8_ = bs._0_8_ & 0xffffffffffffff00;
              bs.buf_ = (buffer *)0x0;
              bs.pos_ = 0;
              iVar6 = launch_servers((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)&bs_2,
                                     false,false,true,(init_options *)&bs);
              std::_Function_base::~_Function_base((_Function_base *)&bs.buf_);
              std::_Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~_Vector_base
                        ((_Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)&bs_2);
              if (iVar6 == 0) {
                std::__cxx11::string::string((string *)&bs,"wait for S2 ready",(allocator *)&bs_2);
                TestSuite::sleep_sec(1,(string *)&bs);
                std::__cxx11::string::~string((string *)&bs);
                if (_Var1 == ((s1_new.raftServer.
                               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->sm_commit_index_).super___atomic_base<unsigned_long>._M_i) {
                  peVar4 = ((s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->raftServer).
                           super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  if (((peVar4->leader_).super___atomic_base<int>._M_i == peVar4->id_) &&
                     ((peVar4->role_)._M_i == leader)) {
                    iVar7 = nuraft::raft_server::get_leader
                                      (s1_new.raftServer.
                                       super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
                    if (iVar7 == 2) {
                      iVar7 = nuraft::raft_server::get_leader
                                        (((s2.
                                           super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->raftServer).
                                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
                      if (iVar7 == 2) {
                        std::__cxx11::to_string((string *)&bs,0xb);
                        nuraft::buffer::alloc((buffer *)&msg_2,(size_t)(bs.buf_ + 4));
                        nuraft::buffer_serializer::buffer_serializer(&bs_2,&msg_2,LITTLE);
                        nuraft::buffer_serializer::put_str(&bs_2,(string *)&bs);
                        peVar4 = ((s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->raftServer).
                                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                                  (&local_290,
                                   &msg_2.
                                    super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
                        __l_03._M_len = 1;
                        __l_03._M_array = (iterator)&local_290;
                        std::
                        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                  *)&msg,__l_03,&local_2c9);
                        nuraft::raft_server::append_entries
                                  ((raft_server *)local_128,
                                   (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                    *)peVar4);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
                        std::
                        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                                   *)&msg);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&local_290._M_refcount);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&msg_2.
                                    super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
                        std::__cxx11::string::~string((string *)&bs);
                        std::__cxx11::string::string
                                  ((string *)&bs,"wait for replication",(allocator *)&bs_2);
                        TestSuite::sleep_sec(1,(string *)&bs);
                        std::__cxx11::string::~string((string *)&bs);
                        _Var9 = _Var9 + 2;
                        if (_Var9 == ((s1_new.raftServer.
                                       super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->sm_commit_index_).super___atomic_base<unsigned_long>
                                     ._M_i) {
                          if (_Var9 == ((((s2.
                                           super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->raftServer).
                                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->sm_commit_index_).
                                       super___atomic_base<unsigned_long>._M_i) {
                            nuraft::raft_server::shutdown
                                      (((s2.
                                         super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->raftServer).
                                       super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,__fd_00,__how_00);
                            nuraft::raft_server::shutdown
                                      (s1_new.raftServer.
                                       super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,__fd_00,__how_01);
                            std::__cxx11::string::string
                                      ((string *)&bs,"shutting down",(allocator *)&bs_2);
                            TestSuite::sleep_sec(1,(string *)&bs);
                            std::__cxx11::string::~string((string *)&bs);
                            iVar6 = 0;
                            SimpleLogger::shutdown(__fd,__how_02);
                            goto LAB_00192033;
                          }
                          poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                          poVar8 = std::operator<<(poVar8,"        time: ");
                          poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
                          TestSuite::getTimeString_abi_cxx11_();
                          poVar8 = std::operator<<(poVar8,(string *)&bs);
                          poVar8 = std::operator<<(poVar8,"\x1b[0m");
                          poVar8 = std::operator<<(poVar8,"\n");
                          poVar8 = std::operator<<(poVar8,"      thread: ");
                          poVar8 = std::operator<<(poVar8,"\x1b[33m");
                          lVar2 = *(long *)poVar8;
                          lVar3 = *(long *)(lVar2 + -0x18);
                          *(uint *)(poVar8 + lVar3 + 0x18) =
                               *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
                          *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                          poVar8 = std::operator<<(poVar8,0x30);
                          bs_2._0_8_ = pthread_self();
                          std::hash<std::thread::id>::operator()
                                    ((hash<std::thread::id> *)&msg,(id *)&bs_2);
                          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                          *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                               *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) &
                               0xffffffb5 | 2;
                          poVar8 = std::operator<<(poVar8,"\x1b[0m");
                          poVar8 = std::operator<<(poVar8,"\n");
                          poVar8 = std::operator<<(poVar8,"          in: ");
                          poVar8 = std::operator<<(poVar8,"\x1b[36m");
                          poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
                          poVar8 = std::operator<<(poVar8,"()\x1b[0m");
                          poVar8 = std::operator<<(poVar8,"\n");
                          poVar8 = std::operator<<(poVar8,"          at: ");
                          poVar8 = std::operator<<(poVar8,"\x1b[32m");
                          poVar8 = std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                          poVar8 = std::operator<<(poVar8,"\x1b[0m:");
                          poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
                          poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x44d);
                          poVar8 = std::operator<<(poVar8,"\x1b[0m");
                          poVar8 = std::operator<<(poVar8,"\n");
                          poVar8 = std::operator<<(poVar8,
                                                  "    value of: \x1b[1;34ms2->raftServer->get_committed_log_idx()\x1b[0m\n"
                                                  );
                          poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
                          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                          poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
                          poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
                          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                          std::operator<<(poVar8,"\x1b[0m\n");
                          std::__cxx11::string::~string((string *)&bs);
                          TestSuite::failHandler();
                        }
                        else {
                          poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                          poVar8 = std::operator<<(poVar8,"        time: ");
                          poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
                          TestSuite::getTimeString_abi_cxx11_();
                          poVar8 = std::operator<<(poVar8,(string *)&bs);
                          poVar8 = std::operator<<(poVar8,"\x1b[0m");
                          poVar8 = std::operator<<(poVar8,"\n");
                          poVar8 = std::operator<<(poVar8,"      thread: ");
                          poVar8 = std::operator<<(poVar8,"\x1b[33m");
                          lVar2 = *(long *)poVar8;
                          lVar3 = *(long *)(lVar2 + -0x18);
                          *(uint *)(poVar8 + lVar3 + 0x18) =
                               *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
                          *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                          poVar8 = std::operator<<(poVar8,0x30);
                          bs_2._0_8_ = pthread_self();
                          std::hash<std::thread::id>::operator()
                                    ((hash<std::thread::id> *)&msg,(id *)&bs_2);
                          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                          *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                               *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) &
                               0xffffffb5 | 2;
                          poVar8 = std::operator<<(poVar8,"\x1b[0m");
                          poVar8 = std::operator<<(poVar8,"\n");
                          poVar8 = std::operator<<(poVar8,"          in: ");
                          poVar8 = std::operator<<(poVar8,"\x1b[36m");
                          poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
                          poVar8 = std::operator<<(poVar8,"()\x1b[0m");
                          poVar8 = std::operator<<(poVar8,"\n");
                          poVar8 = std::operator<<(poVar8,"          at: ");
                          poVar8 = std::operator<<(poVar8,"\x1b[32m");
                          poVar8 = std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                  );
                          poVar8 = std::operator<<(poVar8,"\x1b[0m:");
                          poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
                          poVar8 = (ostream *)std::ostream::operator<<(poVar8,1099);
                          poVar8 = std::operator<<(poVar8,"\x1b[0m");
                          poVar8 = std::operator<<(poVar8,"\n");
                          poVar8 = std::operator<<(poVar8,
                                                  "    value of: \x1b[1;34ms1_new.raftServer->get_committed_log_idx()\x1b[0m\n"
                                                  );
                          poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
                          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                          poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
                          poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
                          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                          std::operator<<(poVar8,"\x1b[0m\n");
                          std::__cxx11::string::~string((string *)&bs);
                          TestSuite::failHandler();
                        }
                      }
                      else {
                        poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        poVar8 = std::operator<<(poVar8,"        time: ");
                        poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
                        TestSuite::getTimeString_abi_cxx11_();
                        poVar8 = std::operator<<(poVar8,(string *)&bs);
                        poVar8 = std::operator<<(poVar8,"\x1b[0m");
                        poVar8 = std::operator<<(poVar8,"\n");
                        poVar8 = std::operator<<(poVar8,"      thread: ");
                        poVar8 = std::operator<<(poVar8,"\x1b[33m");
                        lVar2 = *(long *)poVar8;
                        lVar3 = *(long *)(lVar2 + -0x18);
                        *(uint *)(poVar8 + lVar3 + 0x18) =
                             *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
                        *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                        poVar8 = std::operator<<(poVar8,0x30);
                        bs_2._0_8_ = pthread_self();
                        std::hash<std::thread::id>::operator()
                                  ((hash<std::thread::id> *)&msg,(id *)&bs_2);
                        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                        *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                             *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) &
                             0xffffffb5 | 2;
                        poVar8 = std::operator<<(poVar8,"\x1b[0m");
                        poVar8 = std::operator<<(poVar8,"\n");
                        poVar8 = std::operator<<(poVar8,"          in: ");
                        poVar8 = std::operator<<(poVar8,"\x1b[36m");
                        poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
                        poVar8 = std::operator<<(poVar8,"()\x1b[0m");
                        poVar8 = std::operator<<(poVar8,"\n");
                        poVar8 = std::operator<<(poVar8,"          at: ");
                        poVar8 = std::operator<<(poVar8,"\x1b[32m");
                        poVar8 = std::operator<<(poVar8,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                                );
                        poVar8 = std::operator<<(poVar8,"\x1b[0m:");
                        poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
                        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x43d);
                        poVar8 = std::operator<<(poVar8,"\x1b[0m");
                        poVar8 = std::operator<<(poVar8,"\n");
                        poVar8 = std::operator<<(poVar8,
                                                 "    value of: \x1b[1;34ms2->raftServer->get_leader()\x1b[0m\n"
                                                );
                        poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
                        poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
                        poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
                        poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
                        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
                        std::operator<<(poVar8,"\x1b[0m\n");
                        std::__cxx11::string::~string((string *)&bs);
                        TestSuite::failHandler();
                      }
                    }
                    else {
                      poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                      poVar8 = std::operator<<(poVar8,"        time: ");
                      poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
                      TestSuite::getTimeString_abi_cxx11_();
                      poVar8 = std::operator<<(poVar8,(string *)&bs);
                      poVar8 = std::operator<<(poVar8,"\x1b[0m");
                      poVar8 = std::operator<<(poVar8,"\n");
                      poVar8 = std::operator<<(poVar8,"      thread: ");
                      poVar8 = std::operator<<(poVar8,"\x1b[33m");
                      lVar2 = *(long *)poVar8;
                      lVar3 = *(long *)(lVar2 + -0x18);
                      *(uint *)(poVar8 + lVar3 + 0x18) =
                           *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
                      *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                      poVar8 = std::operator<<(poVar8,0x30);
                      bs_2._0_8_ = pthread_self();
                      std::hash<std::thread::id>::operator()
                                ((hash<std::thread::id> *)&msg,(id *)&bs_2);
                      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                      *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                           *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) &
                           0xffffffb5 | 2;
                      poVar8 = std::operator<<(poVar8,"\x1b[0m");
                      poVar8 = std::operator<<(poVar8,"\n");
                      poVar8 = std::operator<<(poVar8,"          in: ");
                      poVar8 = std::operator<<(poVar8,"\x1b[36m");
                      poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
                      poVar8 = std::operator<<(poVar8,"()\x1b[0m");
                      poVar8 = std::operator<<(poVar8,"\n");
                      poVar8 = std::operator<<(poVar8,"          at: ");
                      poVar8 = std::operator<<(poVar8,"\x1b[32m");
                      poVar8 = std::operator<<(poVar8,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                              );
                      poVar8 = std::operator<<(poVar8,"\x1b[0m:");
                      poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x43c);
                      poVar8 = std::operator<<(poVar8,"\x1b[0m");
                      poVar8 = std::operator<<(poVar8,"\n");
                      poVar8 = std::operator<<(poVar8,
                                               "    value of: \x1b[1;34ms1_new.raftServer->get_leader()\x1b[0m\n"
                                              );
                      poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
                      poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
                      poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
                      std::operator<<(poVar8,"\x1b[0m\n");
                      std::__cxx11::string::~string((string *)&bs);
                      TestSuite::failHandler();
                    }
                  }
                  else {
                    poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    poVar8 = std::operator<<(poVar8,"        time: ");
                    poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
                    TestSuite::getTimeString_abi_cxx11_();
                    poVar8 = std::operator<<(poVar8,(string *)&bs);
                    poVar8 = std::operator<<(poVar8,"\x1b[0m");
                    poVar8 = std::operator<<(poVar8,"\n");
                    poVar8 = std::operator<<(poVar8,"      thread: ");
                    poVar8 = std::operator<<(poVar8,"\x1b[33m");
                    lVar2 = *(long *)poVar8;
                    lVar3 = *(long *)(lVar2 + -0x18);
                    *(uint *)(poVar8 + lVar3 + 0x18) =
                         *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
                    *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                    poVar8 = std::operator<<(poVar8,0x30);
                    bs_2._0_8_ = pthread_self();
                    std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)&msg,(id *)&bs_2);
                    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                    *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                         *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5
                         | 2;
                    poVar8 = std::operator<<(poVar8,"\x1b[0m");
                    poVar8 = std::operator<<(poVar8,"\n");
                    poVar8 = std::operator<<(poVar8,"          in: ");
                    poVar8 = std::operator<<(poVar8,"\x1b[36m");
                    poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
                    poVar8 = std::operator<<(poVar8,"()\x1b[0m");
                    poVar8 = std::operator<<(poVar8,"\n");
                    poVar8 = std::operator<<(poVar8,"          at: ");
                    poVar8 = std::operator<<(poVar8,"\x1b[32m");
                    poVar8 = std::operator<<(poVar8,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                            );
                    poVar8 = std::operator<<(poVar8,"\x1b[0m:");
                    poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
                    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x43b);
                    poVar8 = std::operator<<(poVar8,"\x1b[0m");
                    poVar8 = std::operator<<(poVar8,"\n");
                    poVar8 = std::operator<<(poVar8,
                                             "    value of: \x1b[1;34ms2->raftServer->is_leader()\x1b[0m\n"
                                            );
                    poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
                    poVar8 = std::operator<<(poVar8,"true");
                    poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
                    poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
                    poVar8 = std::operator<<(poVar8,"false");
                    std::operator<<(poVar8,"\x1b[0m\n");
                    std::__cxx11::string::~string((string *)&bs);
                    TestSuite::failHandler();
                  }
                }
                else {
                  poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  poVar8 = std::operator<<(poVar8,"        time: ");
                  poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
                  TestSuite::getTimeString_abi_cxx11_();
                  poVar8 = std::operator<<(poVar8,(string *)&bs);
                  poVar8 = std::operator<<(poVar8,"\x1b[0m");
                  poVar8 = std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(poVar8,"      thread: ");
                  poVar8 = std::operator<<(poVar8,"\x1b[33m");
                  lVar2 = *(long *)poVar8;
                  lVar3 = *(long *)(lVar2 + -0x18);
                  *(uint *)(poVar8 + lVar3 + 0x18) =
                       *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
                  *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                  poVar8 = std::operator<<(poVar8,0x30);
                  bs_2._0_8_ = pthread_self();
                  std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&msg,(id *)&bs_2);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 |
                       2;
                  poVar8 = std::operator<<(poVar8,"\x1b[0m");
                  poVar8 = std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(poVar8,"          in: ");
                  poVar8 = std::operator<<(poVar8,"\x1b[36m");
                  poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
                  poVar8 = std::operator<<(poVar8,"()\x1b[0m");
                  poVar8 = std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(poVar8,"          at: ");
                  poVar8 = std::operator<<(poVar8,"\x1b[32m");
                  poVar8 = std::operator<<(poVar8,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                          );
                  poVar8 = std::operator<<(poVar8,"\x1b[0m:");
                  poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x438);
                  poVar8 = std::operator<<(poVar8,"\x1b[0m");
                  poVar8 = std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(poVar8,
                                           "    value of: \x1b[1;34ms1_new.raftServer->get_committed_log_idx()\x1b[0m\n"
                                          );
                  poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
                  poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  std::operator<<(poVar8,"\x1b[0m\n");
                  std::__cxx11::string::~string((string *)&bs);
                  TestSuite::failHandler();
                }
                iVar6 = -1;
              }
              else {
                poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                poVar8 = std::operator<<(poVar8,"        time: ");
                poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
                TestSuite::getTimeString_abi_cxx11_();
                poVar8 = std::operator<<(poVar8,(string *)&bs);
                poVar8 = std::operator<<(poVar8,"\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,"      thread: ");
                poVar8 = std::operator<<(poVar8,"\x1b[33m");
                lVar2 = *(long *)poVar8;
                lVar3 = *(long *)(lVar2 + -0x18);
                *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8
                ;
                *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
                poVar8 = std::operator<<(poVar8,0x30);
                bs_2._0_8_ = pthread_self();
                std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&msg,(id *)&bs_2);
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                     *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
                poVar8 = std::operator<<(poVar8,"\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,"          in: ");
                poVar8 = std::operator<<(poVar8,"\x1b[36m");
                poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
                poVar8 = std::operator<<(poVar8,"()\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,"          at: ");
                poVar8 = std::operator<<(poVar8,"\x1b[32m");
                poVar8 = std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                        );
                poVar8 = std::operator<<(poVar8,"\x1b[0m:");
                poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x435);
                poVar8 = std::operator<<(poVar8,"\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,
                                         "    value of: \x1b[1;34mlaunch_servers({&s1_new}, false)\x1b[0m\n"
                                        );
                poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
                poVar8 = std::operator<<(poVar8,"0");
                poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
                poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
                iVar6 = -1;
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,-1);
                std::operator<<(poVar8,"\x1b[0m\n");
                std::__cxx11::string::~string((string *)&bs);
                TestSuite::failHandler();
              }
LAB_00192033:
              RaftAsioPkg::~RaftAsioPkg(&s1_new);
              goto LAB_0019071e;
            }
            poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            poVar8 = std::operator<<(poVar8,"        time: ");
            poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar8 = std::operator<<(poVar8,(string *)&s1_new);
            poVar8 = std::operator<<(poVar8,"\x1b[0m");
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"      thread: ");
            poVar8 = std::operator<<(poVar8,"\x1b[33m");
            lVar2 = *(long *)poVar8;
            lVar3 = *(long *)(lVar2 + -0x18);
            *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
            *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
            poVar8 = std::operator<<(poVar8,0x30);
            bs._0_8_ = pthread_self();
            std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                 *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar8 = std::operator<<(poVar8,"\x1b[0m");
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"          in: ");
            poVar8 = std::operator<<(poVar8,"\x1b[36m");
            poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
            poVar8 = std::operator<<(poVar8,"()\x1b[0m");
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"          at: ");
            poVar8 = std::operator<<(poVar8,"\x1b[32m");
            poVar8 = std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                    );
            poVar8 = std::operator<<(poVar8,"\x1b[0m:");
            poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x430);
            poVar8 = std::operator<<(poVar8,"\x1b[0m");
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,
                                     "    value of: \x1b[1;34ms2->raftServer->get_committed_log_idx()\x1b[0m\n"
                                    );
            poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
            poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::operator<<(poVar8,"\x1b[0m\n");
            std::__cxx11::string::~string((string *)&s1_new);
            TestSuite::failHandler();
          }
          else {
            poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            poVar8 = std::operator<<(poVar8,"        time: ");
            poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar8 = std::operator<<(poVar8,(string *)&s1_new);
            poVar8 = std::operator<<(poVar8,"\x1b[0m");
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"      thread: ");
            poVar8 = std::operator<<(poVar8,"\x1b[33m");
            lVar2 = *(long *)poVar8;
            lVar3 = *(long *)(lVar2 + -0x18);
            *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
            *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
            poVar8 = std::operator<<(poVar8,0x30);
            bs._0_8_ = pthread_self();
            std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                 *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar8 = std::operator<<(poVar8,"\x1b[0m");
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"          in: ");
            poVar8 = std::operator<<(poVar8,"\x1b[36m");
            poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
            poVar8 = std::operator<<(poVar8,"()\x1b[0m");
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"          at: ");
            poVar8 = std::operator<<(poVar8,"\x1b[32m");
            poVar8 = std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                    );
            poVar8 = std::operator<<(poVar8,"\x1b[0m:");
            poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x421);
            poVar8 = std::operator<<(poVar8,"\x1b[0m");
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,
                                     "    value of: \x1b[1;34ms2->raftServer->get_leader()\x1b[0m\n"
                                    );
            poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
            poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
            poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
            std::operator<<(poVar8,"\x1b[0m\n");
            std::__cxx11::string::~string((string *)&s1_new);
            TestSuite::failHandler();
          }
          goto LAB_0019071b;
        }
        poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar8 = std::operator<<(poVar8,"        time: ");
        poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar8 = std::operator<<(poVar8,(string *)&s1_new);
        poVar8 = std::operator<<(poVar8,"\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"      thread: ");
        poVar8 = std::operator<<(poVar8,"\x1b[33m");
        lVar2 = *(long *)poVar8;
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
        poVar8 = std::operator<<(poVar8,0x30);
        bs._0_8_ = pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
             *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar8 = std::operator<<(poVar8,"\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"          in: ");
        poVar8 = std::operator<<(poVar8,"\x1b[36m");
        poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
        poVar8 = std::operator<<(poVar8,"()\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"          at: ");
        poVar8 = std::operator<<(poVar8,"\x1b[32m");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                );
        poVar8 = std::operator<<(poVar8,"\x1b[0m:");
        poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x420);
        poVar8 = std::operator<<(poVar8,"\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,
                                 "    value of: \x1b[1;34ms2->raftServer->is_leader()\x1b[0m\n");
        poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
        poVar8 = std::operator<<(poVar8,"true");
        poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
        poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
        poVar8 = std::operator<<(poVar8,"false");
        std::operator<<(poVar8,"\x1b[0m\n");
      }
      else {
        poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar8 = std::operator<<(poVar8,"        time: ");
        poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar8 = std::operator<<(poVar8,(string *)&s1_new);
        poVar8 = std::operator<<(poVar8,"\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"      thread: ");
        poVar8 = std::operator<<(poVar8,"\x1b[33m");
        lVar2 = *(long *)poVar8;
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
        poVar8 = std::operator<<(poVar8,0x30);
        bs._0_8_ = pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
             *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar8 = std::operator<<(poVar8,"\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"          in: ");
        poVar8 = std::operator<<(poVar8,"\x1b[36m");
        poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
        poVar8 = std::operator<<(poVar8,"()\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"          at: ");
        poVar8 = std::operator<<(poVar8,"\x1b[32m");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                );
        poVar8 = std::operator<<(poVar8,"\x1b[0m:");
        poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x415);
        poVar8 = std::operator<<(poVar8,"\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,
                                 "    value of: \x1b[1;34ms2->getTestSm()->isSame( *s1->getTestSm() )\x1b[0m\n"
                                );
        poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
        poVar8 = std::operator<<(poVar8,"true");
        poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
        poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
        poVar8 = std::operator<<(poVar8,"false");
        std::operator<<(poVar8,"\x1b[0m\n");
      }
LAB_00190709:
      std::__cxx11::string::~string((string *)&s1_new);
      TestSuite::failHandler();
    }
    else {
      poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar8 = std::operator<<(poVar8,"        time: ");
      poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar8 = std::operator<<(poVar8,(string *)&s1_new);
      poVar8 = std::operator<<(poVar8,"\x1b[0m");
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"      thread: ");
      poVar8 = std::operator<<(poVar8,"\x1b[33m");
      lVar2 = *(long *)poVar8;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
      poVar8 = std::operator<<(poVar8,0x30);
      bs._0_8_ = pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
           *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar8 = std::operator<<(poVar8,"\x1b[0m");
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"          in: ");
      poVar8 = std::operator<<(poVar8,"\x1b[36m");
      poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
      poVar8 = std::operator<<(poVar8,"()\x1b[0m");
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"          at: ");
      poVar8 = std::operator<<(poVar8,"\x1b[32m");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                              );
      poVar8 = std::operator<<(poVar8,"\x1b[0m:");
      poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x408);
      poVar8 = std::operator<<(poVar8,"\x1b[0m");
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,
                               "    value of: \x1b[1;34ms2->raftServer->get_leader()\x1b[0m\n");
      poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
      poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
      std::operator<<(poVar8,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&s1_new);
      TestSuite::failHandler();
    }
  }
  else {
    poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar8 = std::operator<<(poVar8,"        time: ");
    poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)&s1_new);
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"      thread: ");
    poVar8 = std::operator<<(poVar8,"\x1b[33m");
    lVar2 = *(long *)poVar8;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    poVar8 = std::operator<<(poVar8,0x30);
    bs._0_8_ = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs_2,(id *)&bs);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"          in: ");
    poVar8 = std::operator<<(poVar8,"\x1b[36m");
    poVar8 = std::operator<<(poVar8,"auto_quorum_size_election_test");
    poVar8 = std::operator<<(poVar8,"()\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"          at: ");
    poVar8 = std::operator<<(poVar8,"\x1b[32m");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar8 = std::operator<<(poVar8,"\x1b[0m:");
    poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x407);
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"    value of: \x1b[1;34ms1->raftServer->get_leader()\x1b[0m\n")
    ;
    poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
    poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
    poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
    std::operator<<(poVar8,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&s1_new);
    TestSuite::failHandler();
  }
LAB_0019071b:
  iVar6 = -1;
LAB_0019071e:
  std::_Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~_Vector_base
            (&pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&s2.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&s1.super___shared_ptr<RaftAsioPkg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&s2_addr);
  std::__cxx11::string::~string((string *)&s1_addr);
  return iVar6;
}

Assistant:

int auto_quorum_size_election_test() {
    reset_log_files();

    std::string s1_addr = "tcp://127.0.0.1:20010";
    std::string s2_addr = "tcp://127.0.0.1:20020";

    std::shared_ptr<RaftAsioPkg> s1 = std::make_shared<RaftAsioPkg>(1, s1_addr);
    std::shared_ptr<RaftAsioPkg> s2 = std::make_shared<RaftAsioPkg>(2, s2_addr);
    std::vector<RaftAsioPkg*> pkgs = {s1.get(), s2.get()};

    _msg("launching asio-raft servers\n");
    CHK_Z( launch_servers(pkgs, false) );

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );
    TestSuite::sleep_sec(1, "wait for Raft group ready");

    // Set custom term counter, and enable auto quorum size mode.
    auto custom_inc_term = [](uint64_t cur_term) -> uint64_t {
        return (cur_term / 10) + 10;
    };
    s1->raftServer->set_inc_term_func(custom_inc_term);
    s2->raftServer->set_inc_term_func(custom_inc_term);

    raft_params params = s1->raftServer->get_current_params();
    params.auto_adjust_quorum_for_small_cluster_ = true;
    s1->raftServer->update_params(params);
    s2->raftServer->update_params(params);

    CHK_TRUE( s1->raftServer->is_leader() );
    CHK_EQ(1, s1->raftServer->get_leader());
    CHK_EQ(1, s2->raftServer->get_leader());

    // Replication.
    for (size_t ii=0; ii<10; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1->raftServer->append_entries( {msg} );
    }
    TestSuite::sleep_sec(1, "wait for replication");

    // State machine should be identical.
    CHK_OK( s2->getTestSm()->isSame( *s1->getTestSm() ) );

    // Shutdown S1.
    s1->raftServer->shutdown();
    s1.reset();

    // Wait for adjust quorum and self election.
    TestSuite::sleep_ms( RaftAsioPkg::HEARTBEAT_MS * 50,
                         "wait for quorum adjust" );

    // S2 should be a leader.
    CHK_TRUE( s2->raftServer->is_leader() );
    CHK_EQ(2, s2->raftServer->get_leader());
    uint64_t committed_idx = s2->raftServer->get_committed_log_idx();

    // More replication.
    for (size_t ii=10; ii<11; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s2->raftServer->append_entries( {msg} );
    }

    // Replication should succeed: committed index should be moved forward.
    TestSuite::sleep_sec(1, "wait for replication");
    CHK_EQ( committed_idx + 1,
            s2->raftServer->get_committed_log_idx() );

    // Restart S1.
    _msg("launching S1 again\n");
    RaftAsioPkg s1_new(1, s1_addr);
    CHK_Z( launch_servers({&s1_new}, false) );
    TestSuite::sleep_sec(1, "wait for S2 ready");
    CHK_EQ( committed_idx + 1,
            s1_new.raftServer->get_committed_log_idx() );

    // S2 should remain as a leader.
    CHK_TRUE( s2->raftServer->is_leader() );
    CHK_EQ(2, s1_new.raftServer->get_leader());
    CHK_EQ(2, s2->raftServer->get_leader());

    // More replication.
    for (size_t ii=11; ii<12; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s2->raftServer->append_entries( {msg} );
    }

    // Both of them should have the same commit number.
    TestSuite::sleep_sec(1, "wait for replication");
    CHK_EQ( committed_idx + 2,
            s1_new.raftServer->get_committed_log_idx() );
    CHK_EQ( committed_idx + 2,
            s2->raftServer->get_committed_log_idx() );

    s2->raftServer->shutdown();
    s1_new.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}